

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::CampaignReader::InitTransports(CampaignReader *this)

{
  pointer *pppIVar1;
  pointer *pppEVar2;
  Mode mode;
  pointer pcVar3;
  size_type sVar4;
  unsigned_long uVar5;
  pointer pbVar6;
  _Base_ptr p_Var7;
  ADIOS *this_00;
  pointer pCVar8;
  size_t __n;
  _Alloc_hider _Var9;
  CampaignBPFile *pCVar10;
  sqlite3 *db;
  iterator __position;
  iterator __position_00;
  uint uVar11;
  bool bVar12;
  char cVar13;
  int iVar14;
  uint uVar15;
  DataType DVar16;
  long *plVar17;
  char *pcVar18;
  undefined8 *puVar19;
  ostream *poVar20;
  _Rb_tree_node_base *p_Var21;
  IO *this_01;
  const_iterator cVar22;
  HostOptions *hostOptions;
  Engine *pEVar23;
  Variable<signed_char> *variable;
  Variable<char> *variable_00;
  Variable<std::complex<float>_> *variable_01;
  Variable<unsigned_char> *variable_02;
  Variable<std::complex<double>_> *variable_03;
  Variable<double> *variable_04;
  Variable<int> *variable_05;
  Variable<long> *variable_06;
  Variable<unsigned_long> *variable_07;
  Variable<short> *variable_08;
  Variable<unsigned_short> *variable_09;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_10;
  Variable<unsigned_int> *variable_11;
  Variable<long_double> *variable_12;
  Variable<float> *variable_13;
  Attribute<signed_char> *attribute;
  Attribute<char> *attribute_00;
  Attribute<std::complex<float>_> *attribute_01;
  Attribute<unsigned_char> *attribute_02;
  Attribute<std::complex<double>_> *attribute_03;
  Attribute<double> *attribute_04;
  Attribute<int> *attribute_05;
  Attribute<long> *attribute_06;
  Attribute<unsigned_long> *attribute_07;
  Attribute<short> *attribute_08;
  Attribute<unsigned_short> *attribute_09;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute_10;
  Attribute<unsigned_int> *attribute_11;
  Attribute<long_double> *attribute_12;
  Attribute<float> *attribute_13;
  _Rb_tree_node_base *p_Var24;
  ulong *puVar25;
  size_type *psVar26;
  pointer pCVar27;
  long *plVar28;
  uint uVar29;
  CampaignBPFile *bpfile;
  undefined8 uVar30;
  uint __uval;
  uint uVar31;
  ulong uVar32;
  _Base_ptr p_Var33;
  pointer pCVar34;
  CampaignBPFile *bpf;
  ulong uVar35;
  long lVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  uint uVar38;
  string __str_3;
  __string_type __str_4;
  string fname;
  __string_type __str;
  VarInternalInfo internalInfo;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  amap;
  string localPath;
  string path;
  string path2;
  string local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  long *local_7b0;
  ulong local_7a8;
  long local_7a0;
  long lStack_798;
  undefined1 local_790 [48];
  Remote *local_760;
  VarInternalInfo local_758;
  undefined1 local_738 [48];
  string local_708;
  _Base_ptr local_6e8;
  long local_6e0;
  sqlite3 **local_6d8;
  uint local_6cc;
  string local_6c8;
  undefined1 local_6a8 [8];
  _Alloc_hider _Stack_6a0;
  undefined1 local_698 [24];
  undefined8 local_680;
  ios_base local_5b0 [488];
  string local_3c8;
  vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *local_3a8;
  vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *local_3a0;
  undefined8 local_398;
  ulong *local_390;
  string *local_388;
  _Base_ptr local_380;
  Comm local_378;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  pcVar3 = (this->super_Engine).m_Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6c8,pcVar3,pcVar3 + (this->super_Engine).m_Name._M_string_length);
  bVar12 = adios2sys::SystemTools::FileExists(&local_6c8);
  if ((((!bVar12) && (*local_6c8._M_dataplus._M_p != '/')) && (*local_6c8._M_dataplus._M_p != '\\'))
     && (sVar4 = (this->m_Options).campaignstorepath._M_string_length, sVar4 != 0)) {
    pcVar3 = (this->m_Options).campaignstorepath._M_dataplus._M_p;
    local_790._0_8_ = local_790 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_790,pcVar3,pcVar3 + sVar4);
    std::__cxx11::string::_M_replace_aux((ulong)local_790,local_790._8_8_,0,'\x01');
    plVar17 = (long *)std::__cxx11::string::_M_append
                                (local_790,(ulong)(this->super_Engine).m_Name._M_dataplus._M_p);
    puVar25 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar25) {
      local_698._0_8_ = *puVar25;
      local_698._8_8_ = plVar17[3];
      local_6a8 = (undefined1  [8])local_698;
    }
    else {
      local_698._0_8_ = *puVar25;
      local_6a8 = (undefined1  [8])*plVar17;
    }
    _Stack_6a0._M_p = (pointer)plVar17[1];
    *plVar17 = (long)puVar25;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((undefined1 *)local_790._0_8_ != local_790 + 0x10) {
      operator_delete((void *)local_790._0_8_);
    }
    bVar12 = adios2sys::SystemTools::FileExists((string *)local_6a8);
    if (bVar12) {
      std::__cxx11::string::_M_assign((string *)&local_6c8);
    }
    if (local_6a8 != (undefined1  [8])local_698) {
      operator_delete((void *)local_6a8);
    }
  }
  local_6d8 = &this->m_DB;
  iVar14 = sqlite3_open(local_6c8._M_dataplus._M_p);
  if (iVar14 != 0) {
    pcVar18 = (char *)sqlite3_errmsg(*local_6d8);
    std::__cxx11::string::string((string *)local_6a8,pcVar18,(allocator *)local_790);
    sqlite3_close(*local_6d8);
    local_790._0_8_ = local_790 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Engine","");
    local_738._0_8_ = local_738 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"CampaignReader","");
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"Open","");
    std::operator+(&local_7d0,"Cannot open database",&local_6c8);
    puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_7d0);
    plVar17 = puVar19 + 2;
    if ((long *)*puVar19 == plVar17) {
      local_7a0 = *plVar17;
      lStack_798 = puVar19[3];
      local_7b0 = &local_7a0;
    }
    else {
      local_7a0 = *plVar17;
      local_7b0 = (long *)*puVar19;
    }
    local_7a8 = puVar19[1];
    *puVar19 = plVar17;
    puVar19[1] = 0;
    *(undefined1 *)(puVar19 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_7b0,(ulong)local_6a8);
    puVar25 = (ulong *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar25) {
      local_7f0.field_2._M_allocated_capacity = *puVar25;
      local_7f0.field_2._8_8_ = plVar17[3];
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
    }
    else {
      local_7f0.field_2._M_allocated_capacity = *puVar25;
      local_7f0._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_7f0._M_string_length = plVar17[1];
    *plVar17 = (long)puVar25;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    helper::Throw<std::invalid_argument>
              ((string *)local_790,(string *)local_738,&local_708,&local_7f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
      operator_delete(local_7f0._M_dataplus._M_p);
    }
    if (local_7b0 != &local_7a0) {
      operator_delete(local_7b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
      operator_delete(local_7d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p);
    }
    if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
      operator_delete((void *)local_738._0_8_);
    }
    if ((undefined1 *)local_790._0_8_ != local_790 + 0x10) {
      operator_delete((void *)local_790._0_8_);
    }
    if (local_6a8 != (undefined1  [8])local_698) {
      operator_delete((void *)local_6a8);
    }
  }
  ReadCampaignData(this->m_DB,&this->m_CampaignData);
  if (0 < (this->m_Options).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Local hostname = ",0x11);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(this->m_Options).hostname._M_dataplus._M_p,
                         (this->m_Options).hostname._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Database result:\n  version = ",0x1d);
    poVar20 = std::ostream::_M_insert<double>((this->m_CampaignData).version.version);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n  hosts:\n",10);
    pCVar34 = (this->m_CampaignData).hosts.
              super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_CampaignData).hosts.
        super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar34) {
      uVar35 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    host = ",0xb);
        pCVar34 = pCVar34 + uVar35;
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(pCVar34->hostname)._M_dataplus._M_p,
                             (pCVar34->hostname)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"  long name = ",0xe);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(pCVar34->longhostname)._M_dataplus._M_p,
                             (pCVar34->longhostname)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"  directories: \n",0x10);
        if ((pCVar34->dirIdx).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (pCVar34->dirIdx).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar32 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"      dir = ",0xc);
            uVar5 = (pCVar34->dirIdx).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar32];
            pbVar6 = (this->m_CampaignData).directory.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pbVar6[uVar5]._M_dataplus._M_p,
                                 pbVar6[uVar5]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            uVar32 = uVar32 + 1;
          } while (uVar32 < (ulong)((long)(pCVar34->dirIdx).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pCVar34->dirIdx).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        uVar35 = uVar35 + 1;
        pCVar34 = (this->m_CampaignData).hosts.
                  super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar35 < (ulong)(((long)(this->m_CampaignData).hosts.
                                       super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar34 >>
                                3) * 0x2e8ba2e8ba2e8ba3));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  keys:\n",8);
    pCVar27 = (this->m_CampaignData).keys.
              super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_CampaignData).keys.
        super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar27) {
      lVar36 = 8;
      uVar35 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    key = ",10);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)((long)pCVar27 + lVar36 + -8),
                             *(long *)((long)&(pCVar27->id)._M_dataplus._M_p + lVar36));
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
        uVar35 = uVar35 + 1;
        pCVar27 = (this->m_CampaignData).keys.
                  super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar36 = lVar36 + 0x40;
      } while (uVar35 < (ulong)((long)(this->m_CampaignData).keys.
                                      super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar27 >>
                               6));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  datasets:\n",0xc);
    for (p_Var21 = (this->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var21 !=
        &(this->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header;
        p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      pCVar34 = (this->m_CampaignData).hosts.
                super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           pCVar34[(long)p_Var21[3]._M_parent].hostname._M_dataplus._M_p,
                           pCVar34[(long)p_Var21[3]._M_parent].hostname._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,":",1);
      pbVar6 = (this->m_CampaignData).directory.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar20,pbVar6[(long)p_Var21[3]._M_left]._M_dataplus._M_p,
                           pbVar6[(long)p_Var21[3]._M_left]._M_string_length);
      local_6a8[0] = 0x2f;
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_6a8,1);
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar20,(char *)p_Var21[2]._M_parent,(long)p_Var21[2]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"      uuid: ",0xc);
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)p_Var21[1]._M_parent,
                           (long)p_Var21[1]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      p_Var7 = p_Var21[4]._M_left;
      for (p_Var33 = p_Var21[4]._M_parent; p_Var33 != p_Var7;
          p_Var33 = (_Base_ptr)&p_Var33[2]._M_parent) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"      file: ",0xc)
        ;
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)p_Var33,(long)p_Var33->_M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      }
    }
  }
  p_Var33 = (this->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_380 = &(this->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var33 != local_380) {
    local_390 = _VTT;
    local_398 = _pthread_rwlock_init;
    local_388 = (string *)&(this->super_Engine).m_Comm;
    local_3a0 = (vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *)&this->m_IOs;
    local_3a8 = (vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *)
                &this->m_Engines;
    local_760 = (Remote *)0x0;
    uVar31 = 0xffffffff;
    local_6e8 = p_Var33;
    do {
      uVar31 = uVar31 + 1;
      uVar29 = 1;
      if (9 < uVar31) {
        uVar38 = uVar31;
        uVar11 = 4;
        do {
          uVar29 = uVar11;
          if (uVar38 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_00651b44;
          }
          if (uVar38 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_00651b44;
          }
          if (uVar38 < 10000) goto LAB_00651b44;
          bVar12 = 99999 < uVar38;
          uVar38 = uVar38 / 10000;
          uVar11 = uVar29 + 4;
        } while (bVar12);
        uVar29 = uVar29 + 1;
      }
LAB_00651b44:
      this_00 = ((this->super_Engine).m_IO)->m_ADIOS;
      local_6a8 = (undefined1  [8])local_698;
      std::__cxx11::string::_M_construct
                ((ulong)local_6a8,(char)uVar29 - (char)((int)uVar31 >> 0x1f));
      local_6cc = uVar31;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_6a8 + (ulong)(uVar31 >> 0x1f)),uVar29,uVar31);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)local_6a8,0,(char *)0x0,0x750a82);
      p_Var33 = local_6e8;
      psVar26 = (size_type *)(plVar17 + 2);
      paVar37 = &local_7f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar26) {
        local_3c8.field_2._M_allocated_capacity = *psVar26;
        local_3c8.field_2._8_8_ = plVar17[3];
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      }
      else {
        local_3c8.field_2._M_allocated_capacity = *psVar26;
        local_3c8._M_dataplus._M_p = (pointer)*plVar17;
      }
      local_3c8._M_string_length = plVar17[1];
      *plVar17 = (long)psVar26;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      this_01 = ADIOS::DeclareIO(this_00,&local_3c8,Auto);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if (local_6a8 != (undefined1  [8])local_698) {
        operator_delete((void *)local_6a8);
      }
      local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
      local_708._M_string_length = 0;
      local_708.field_2._M_local_buf[0] = '\0';
      pCVar8 = (this->m_CampaignData).hosts.
               super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar34 = pCVar8 + (long)p_Var33[3]._M_parent;
      __n = pCVar8[(long)p_Var33[3]._M_parent].hostname._M_string_length;
      if ((__n == (this->m_Options).hostname._M_string_length) &&
         ((__n == 0 ||
          (iVar14 = bcmp((pCVar34->hostname)._M_dataplus._M_p,
                         (this->m_Options).hostname._M_dataplus._M_p,__n), iVar14 == 0)))) {
        pbVar6 = (this->m_CampaignData).directory.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_790._0_8_ = local_790 + 0x10;
        pcVar3 = pbVar6[(long)p_Var33[3]._M_left]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_790,pcVar3,
                   pcVar3 + pbVar6[(long)p_Var33[3]._M_left]._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)local_790,local_790._8_8_,0,'\x01');
        plVar17 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_790,(ulong)p_Var33[2]._M_parent);
        puVar25 = (ulong *)(plVar17 + 2);
        if ((ulong *)*plVar17 == puVar25) {
          local_698._0_8_ = *puVar25;
          local_698._8_8_ = plVar17[3];
          local_6a8 = (undefined1  [8])local_698;
        }
        else {
          local_698._0_8_ = *puVar25;
          local_6a8 = (undefined1  [8])*plVar17;
        }
        _Stack_6a0._M_p = (pointer)plVar17[1];
        *plVar17 = (long)puVar25;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_708,(string *)local_6a8);
        if (local_6a8 != (undefined1  [8])local_698) {
          operator_delete((void *)local_6a8);
        }
        if ((undefined1 *)local_790._0_8_ != local_790 + 0x10) {
          operator_delete((void *)local_790._0_8_);
        }
        if (0 < (this->m_Options).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Open local file ",0x10);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_708._M_dataplus._M_p,
                               local_708._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
        }
LAB_00653201:
        paVar37 = &local_7f0.field_2;
        mode = (this->super_Engine).m_OpenMode;
        local_6a8 = (undefined1  [8])local_698;
        _Stack_6a0._M_p = (pointer)0x0;
        local_698._0_8_ = local_698._0_8_ & 0xffffffffffffff00;
        helper::Comm::Duplicate(&local_378,local_388);
        pEVar23 = IO::Open(this_01,&local_708,mode,&local_378,(char *)0x0,0);
        helper::Comm::~Comm(&local_378);
        if (local_6a8 != (undefined1  [8])local_698) {
          operator_delete((void *)local_6a8);
        }
        __position._M_current =
             (this->m_IOs).
             super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_IOs).
            super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_6a8 = (undefined1  [8])this_01;
          std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
          _M_realloc_insert<adios2::core::IO*>(local_3a0,__position,(IO **)local_6a8);
        }
        else {
          *__position._M_current = this_01;
          pppIVar1 = &(this->m_IOs).
                      super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
        __position_00._M_current =
             (this->m_Engines).
             super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->m_Engines).
            super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_6a8 = (undefined1  [8])pEVar23;
          std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
          _M_realloc_insert<adios2::core::Engine*>(local_3a8,__position_00,(Engine **)local_6a8);
        }
        else {
          *__position_00._M_current = pEVar23;
          pppEVar2 = &(this->m_Engines).
                      super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar2 = *pppEVar2 + 1;
        }
        local_698._0_8_ = 0;
        local_6a8 = (undefined1  [8])0x0;
        _Stack_6a0._M_p = (pointer)0x0;
        local_698._8_8_ = &_Stack_6a0;
        local_680._0_4_ = None;
        local_680._4_4_ = 0;
        local_698._16_8_ = local_698._8_8_;
        IO::GetAvailableVariables
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)local_790,this_01,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_6a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_6a8);
        local_6a8 = (undefined1  [8])local_698;
        _Stack_6a0._M_p = (pointer)0x0;
        local_698._0_8_ = local_698._0_8_ & 0xffffffffffffff00;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/","");
        IO::GetAvailableAttributes
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)local_738,this_01,(string *)local_6a8,&local_d0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (local_6a8 != (undefined1  [8])local_698) {
          operator_delete((void *)local_6a8);
        }
        local_758.ioIdx =
             ((long)(this->m_IOs).
                    super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_IOs).
                    super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
        local_758.engineIdx =
             ((long)(this->m_Engines).
                    super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_Engines).
                    super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
        local_758.originalVar = (size_t *)0x0;
        for (p_Var21 = (_Rb_tree_node_base *)local_790._24_8_;
            p_Var24 = (_Rb_tree_node_base *)local_738._24_8_,
            p_Var21 != (_Rb_tree_node_base *)(local_790 + 8);
            p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
          local_7f0._M_dataplus._M_p = (pointer)paVar37;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7f0,*(long *)(p_Var21 + 1),
                     (long)&(p_Var21[1]._M_parent)->_M_color + *(long *)(p_Var21 + 1));
          local_7b0 = &local_7a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7b0,p_Var33[2]._M_parent,
                     (long)&(p_Var33[2]._M_left)->_M_color + (long)p_Var33[2]._M_parent);
          local_6a8 = (undefined1  [8])local_698;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6a8,local_7b0,(undefined1 *)(local_7a8 + (long)local_7b0));
          std::__cxx11::string::append((char *)local_6a8);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)local_6a8,(ulong)local_7f0._M_dataplus._M_p);
          local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
          puVar25 = puVar19 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_7d0.field_2._M_allocated_capacity = *puVar25;
            local_7d0.field_2._8_8_ = puVar19[3];
          }
          else {
            local_7d0.field_2._M_allocated_capacity = *puVar25;
            local_7d0._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_7d0._M_string_length = puVar19[1];
          *puVar19 = puVar25;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          if (local_6a8 != (undefined1  [8])local_698) {
            operator_delete((void *)local_6a8);
          }
          DVar16 = IO::InquireVariableType(this_01,&local_7f0);
          switch(DVar16) {
          case Int8:
            variable = IO::InquireVariable<signed_char>(this_01,&local_7f0);
            DuplicateVariable<signed_char>
                      ((Variable<signed_char> *)local_6a8,this,variable,(this->super_Engine).m_IO,
                       &local_7d0,&local_758);
            Variable<signed_char>::~Variable((Variable<signed_char> *)local_6a8);
            break;
          case Int16:
            variable_08 = IO::InquireVariable<short>(this_01,&local_7f0);
            DuplicateVariable<short>
                      ((Variable<short> *)local_6a8,this,variable_08,(this->super_Engine).m_IO,
                       &local_7d0,&local_758);
            Variable<short>::~Variable((Variable<short> *)local_6a8);
            break;
          case Int32:
            variable_05 = IO::InquireVariable<int>(this_01,&local_7f0);
            DuplicateVariable<int>
                      ((Variable<int> *)local_6a8,this,variable_05,(this->super_Engine).m_IO,
                       &local_7d0,&local_758);
            Variable<int>::~Variable((Variable<int> *)local_6a8);
            break;
          case Int64:
            variable_06 = IO::InquireVariable<long>(this_01,&local_7f0);
            DuplicateVariable<long>
                      ((Variable<long> *)local_6a8,this,variable_06,(this->super_Engine).m_IO,
                       &local_7d0,&local_758);
            Variable<long>::~Variable((Variable<long> *)local_6a8);
            break;
          case UInt8:
            variable_02 = IO::InquireVariable<unsigned_char>(this_01,&local_7f0);
            DuplicateVariable<unsigned_char>
                      ((Variable<unsigned_char> *)local_6a8,this,variable_02,
                       (this->super_Engine).m_IO,&local_7d0,&local_758);
            Variable<unsigned_char>::~Variable((Variable<unsigned_char> *)local_6a8);
            break;
          case UInt16:
            variable_09 = IO::InquireVariable<unsigned_short>(this_01,&local_7f0);
            DuplicateVariable<unsigned_short>
                      ((Variable<unsigned_short> *)local_6a8,this,variable_09,
                       (this->super_Engine).m_IO,&local_7d0,&local_758);
            Variable<unsigned_short>::~Variable((Variable<unsigned_short> *)local_6a8);
            break;
          case UInt32:
            variable_11 = IO::InquireVariable<unsigned_int>(this_01,&local_7f0);
            DuplicateVariable<unsigned_int>
                      ((Variable<unsigned_int> *)local_6a8,this,variable_11,
                       (this->super_Engine).m_IO,&local_7d0,&local_758);
            Variable<unsigned_int>::~Variable((Variable<unsigned_int> *)local_6a8);
            break;
          case UInt64:
            variable_07 = IO::InquireVariable<unsigned_long>(this_01,&local_7f0);
            DuplicateVariable<unsigned_long>
                      ((Variable<unsigned_long> *)local_6a8,this,variable_07,
                       (this->super_Engine).m_IO,&local_7d0,&local_758);
            Variable<unsigned_long>::~Variable((Variable<unsigned_long> *)local_6a8);
            break;
          case Float:
            variable_13 = IO::InquireVariable<float>(this_01,&local_7f0);
            DuplicateVariable<float>
                      ((Variable<float> *)local_6a8,this,variable_13,(this->super_Engine).m_IO,
                       &local_7d0,&local_758);
            Variable<float>::~Variable((Variable<float> *)local_6a8);
            break;
          case Double:
            variable_04 = IO::InquireVariable<double>(this_01,&local_7f0);
            DuplicateVariable<double>
                      ((Variable<double> *)local_6a8,this,variable_04,(this->super_Engine).m_IO,
                       &local_7d0,&local_758);
            Variable<double>::~Variable((Variable<double> *)local_6a8);
            break;
          case LongDouble:
            variable_12 = IO::InquireVariable<long_double>(this_01,&local_7f0);
            DuplicateVariable<long_double>
                      ((Variable<long_double> *)local_6a8,this,variable_12,(this->super_Engine).m_IO
                       ,&local_7d0,&local_758);
            Variable<long_double>::~Variable((Variable<long_double> *)local_6a8);
            break;
          case FloatComplex:
            variable_01 = IO::InquireVariable<std::complex<float>>(this_01,&local_7f0);
            DuplicateVariable<std::complex<float>>
                      ((Variable<std::complex<float>_> *)local_6a8,this,variable_01,
                       (this->super_Engine).m_IO,&local_7d0,&local_758);
            Variable<std::complex<float>_>::~Variable((Variable<std::complex<float>_> *)local_6a8);
            break;
          case DoubleComplex:
            variable_03 = IO::InquireVariable<std::complex<double>>(this_01,&local_7f0);
            DuplicateVariable<std::complex<double>>
                      ((Variable<std::complex<double>_> *)local_6a8,this,variable_03,
                       (this->super_Engine).m_IO,&local_7d0,&local_758);
            Variable<std::complex<double>_>::~Variable((Variable<std::complex<double>_> *)local_6a8)
            ;
            break;
          case String:
            variable_10 = IO::InquireVariable<std::__cxx11::string>(this_01,&local_7f0);
            DuplicateVariable<std::__cxx11::string>
                      ((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_6a8,this,variable_10,(this->super_Engine).m_IO,&local_7d0,&local_758
                      );
            Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Variable((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_6a8);
            break;
          case Char:
            variable_00 = IO::InquireVariable<char>(this_01,&local_7f0);
            DuplicateVariable<char>
                      ((Variable<char> *)local_6a8,this,variable_00,(this->super_Engine).m_IO,
                       &local_7d0,&local_758);
            Variable<char>::~Variable((Variable<char> *)local_6a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
            operator_delete(local_7d0._M_dataplus._M_p);
          }
          if (local_7b0 != &local_7a0) {
            operator_delete(local_7b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != paVar37) {
            operator_delete(local_7f0._M_dataplus._M_p);
          }
        }
        for (; p_Var24 != (_Rb_tree_node_base *)(local_738 + 8);
            p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
          local_7f0._M_dataplus._M_p = (pointer)paVar37;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7f0,*(long *)(p_Var24 + 1),
                     (long)&(p_Var24[1]._M_parent)->_M_color + *(long *)(p_Var24 + 1));
          local_7b0 = &local_7a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7b0,p_Var33[2]._M_parent,
                     (long)&(p_Var33[2]._M_left)->_M_color + (long)p_Var33[2]._M_parent);
          local_6a8 = (undefined1  [8])local_698;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6a8,local_7b0,(undefined1 *)(local_7a8 + (long)local_7b0));
          std::__cxx11::string::append((char *)local_6a8);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)local_6a8,(ulong)local_7f0._M_dataplus._M_p);
          local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
          puVar25 = puVar19 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_7d0.field_2._M_allocated_capacity = *puVar25;
            local_7d0.field_2._8_8_ = puVar19[3];
          }
          else {
            local_7d0.field_2._M_allocated_capacity = *puVar25;
            local_7d0._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_7d0._M_string_length = puVar19[1];
          *puVar19 = puVar25;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          if (local_6a8 != (undefined1  [8])local_698) {
            operator_delete((void *)local_6a8);
          }
          local_6a8 = (undefined1  [8])local_698;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
          DVar16 = IO::InquireAttributeType(this_01,&local_7f0,(string *)local_6a8,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if (local_6a8 != (undefined1  [8])local_698) {
            operator_delete((void *)local_6a8);
          }
          switch(DVar16) {
          case Int8:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/","");
            attribute = IO::InquireAttribute<signed_char>
                                  (this_01,&local_7f0,(string *)local_6a8,&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<signed_char>
                      ((Attribute<signed_char> *)local_6a8,this,attribute,(this->super_Engine).m_IO,
                       &local_7d0);
            Attribute<signed_char>::~Attribute((Attribute<signed_char> *)local_6a8);
            break;
          case Int16:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/","");
            attribute_08 = IO::InquireAttribute<short>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_170);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<short>
                      ((Attribute<short> *)local_6a8,this,attribute_08,(this->super_Engine).m_IO,
                       &local_7d0);
            Attribute<short>::~Attribute((Attribute<short> *)local_6a8);
            break;
          case Int32:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/","");
            attribute_05 = IO::InquireAttribute<int>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_190);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<int>
                      ((Attribute<int> *)local_6a8,this,attribute_05,(this->super_Engine).m_IO,
                       &local_7d0);
            Attribute<int>::~Attribute((Attribute<int> *)local_6a8);
            break;
          case Int64:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/","");
            attribute_06 = IO::InquireAttribute<long>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_1b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<long>
                      ((Attribute<long> *)local_6a8,this,attribute_06,(this->super_Engine).m_IO,
                       &local_7d0);
            Attribute<long>::~Attribute((Attribute<long> *)local_6a8);
            break;
          case UInt8:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"/","");
            attribute_02 = IO::InquireAttribute<unsigned_char>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<unsigned_char>
                      ((Attribute<unsigned_char> *)local_6a8,this,attribute_02,
                       (this->super_Engine).m_IO,&local_7d0);
            Attribute<unsigned_char>::~Attribute((Attribute<unsigned_char> *)local_6a8);
            break;
          case UInt16:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/","");
            attribute_09 = IO::InquireAttribute<unsigned_short>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<unsigned_short>
                      ((Attribute<unsigned_short> *)local_6a8,this,attribute_09,
                       (this->super_Engine).m_IO,&local_7d0);
            Attribute<unsigned_short>::~Attribute((Attribute<unsigned_short> *)local_6a8);
            break;
          case UInt32:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/","");
            attribute_11 = IO::InquireAttribute<unsigned_int>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<unsigned_int>
                      ((Attribute<unsigned_int> *)local_6a8,this,attribute_11,
                       (this->super_Engine).m_IO,&local_7d0);
            Attribute<unsigned_int>::~Attribute((Attribute<unsigned_int> *)local_6a8);
            break;
          case UInt64:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/","");
            attribute_07 = IO::InquireAttribute<unsigned_long>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<unsigned_long>
                      ((Attribute<unsigned_long> *)local_6a8,this,attribute_07,
                       (this->super_Engine).m_IO,&local_7d0);
            Attribute<unsigned_long>::~Attribute((Attribute<unsigned_long> *)local_6a8);
            break;
          case Float:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/","");
            attribute_13 = IO::InquireAttribute<float>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_250);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<float>
                      ((Attribute<float> *)local_6a8,this,attribute_13,(this->super_Engine).m_IO,
                       &local_7d0);
            Attribute<float>::~Attribute((Attribute<float> *)local_6a8);
            break;
          case Double:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/","");
            attribute_04 = IO::InquireAttribute<double>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_270);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<double>
                      ((Attribute<double> *)local_6a8,this,attribute_04,(this->super_Engine).m_IO,
                       &local_7d0);
            Attribute<double>::~Attribute((Attribute<double> *)local_6a8);
            break;
          case LongDouble:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"/","");
            attribute_12 = IO::InquireAttribute<long_double>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_290);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<long_double>
                      ((Attribute<long_double> *)local_6a8,this,attribute_12,
                       (this->super_Engine).m_IO,&local_7d0);
            Attribute<long_double>::~Attribute((Attribute<long_double> *)local_6a8);
            break;
          case FloatComplex:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"/","");
            attribute_01 = IO::InquireAttribute<std::complex<float>>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_2b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<std::complex<float>>
                      ((Attribute<std::complex<float>_> *)local_6a8,this,attribute_01,
                       (this->super_Engine).m_IO,&local_7d0);
            Attribute<std::complex<float>_>::~Attribute
                      ((Attribute<std::complex<float>_> *)local_6a8);
            break;
          case DoubleComplex:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"/","");
            attribute_03 = IO::InquireAttribute<std::complex<double>>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_2d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<std::complex<double>>
                      ((Attribute<std::complex<double>_> *)local_6a8,this,attribute_03,
                       (this->super_Engine).m_IO,&local_7d0);
            Attribute<std::complex<double>_>::~Attribute
                      ((Attribute<std::complex<double>_> *)local_6a8);
            break;
          case String:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/","");
            attribute_10 = IO::InquireAttribute<std::__cxx11::string>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<std::__cxx11::string>
                      ((Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_6a8,this,attribute_10,(this->super_Engine).m_IO,&local_7d0);
            Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Attribute((Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_6a8);
            break;
          case Char:
            local_6a8 = (undefined1  [8])local_698;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"");
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"/","");
            attribute_00 = IO::InquireAttribute<char>
                                     (this_01,&local_7f0,(string *)local_6a8,&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p);
            }
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            DuplicateAttribute<char>
                      ((Attribute<char> *)local_6a8,this,attribute_00,(this->super_Engine).m_IO,
                       &local_7d0);
            Attribute<char>::~Attribute((Attribute<char> *)local_6a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
            operator_delete(local_7d0._M_dataplus._M_p);
          }
          if (local_7b0 != &local_7a0) {
            operator_delete(local_7b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != paVar37) {
            operator_delete(local_7f0._M_dataplus._M_p);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     *)local_738);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     *)local_790);
      }
      else {
        cVar22 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
                 ::find(&((this->super_Engine).m_HostOptions)->_M_t,&pCVar34->hostname);
        if (((_Rb_tree_header *)cVar22._M_node !=
             &(((this->super_Engine).m_HostOptions)->_M_t)._M_impl.super__Rb_tree_header) &&
           (lVar36 = *(long *)(cVar22._M_node + 2), *(int *)(lVar36 + 0x20) == 3)) {
          local_790._0_8_ = local_790 + 0x10;
          local_6e0 = lVar36;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_790,*(long *)(lVar36 + 0x90),
                     *(long *)(lVar36 + 0x98) + *(long *)(lVar36 + 0x90));
          pbVar6 = (this->m_CampaignData).directory.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_6a8 = (undefined1  [8])local_698;
          pcVar3 = pbVar6[(long)p_Var33[3]._M_left]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6a8,pcVar3,
                     pcVar3 + pbVar6[(long)p_Var33[3]._M_left]._M_string_length);
          std::__cxx11::string::append((char *)local_6a8);
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_6a8,(ulong)p_Var33[2]._M_parent);
          local_738._0_8_ = local_738 + 0x10;
          psVar26 = (size_type *)(plVar17 + 2);
          if ((size_type *)*plVar17 == psVar26) {
            local_738._16_8_ = *psVar26;
            local_738._24_8_ = plVar17[3];
          }
          else {
            local_738._16_8_ = *psVar26;
            local_738._0_8_ = (size_type *)*plVar17;
          }
          local_738._8_8_ = plVar17[1];
          *plVar17 = (long)psVar26;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          if (local_6a8 != (undefined1  [8])local_698) {
            operator_delete((void *)local_6a8);
          }
          _Stack_6a0._M_p = _Stack_6a0._M_p & 0xffffffff00000000;
          local_698._0_8_ = 0;
          local_698._8_8_ = &_Stack_6a0;
          local_680._0_4_ = None;
          local_680._4_4_ = 0;
          local_698._16_8_ = local_698._8_8_;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[8],char_const(&)[7]>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_6a8,(char (*) [8])0x7483d4,(char (*) [7])"awssdk");
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[9],std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_6a8,(char (*) [9])"endpoint",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_790)
          ;
          local_758.originalVar = &local_758.engineIdx;
          pcVar3 = (this->m_Options).cachepath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_758,pcVar3,
                     pcVar3 + (this->m_Options).cachepath._M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_758,local_758.ioIdx,0,'\x01');
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_758,
                                       (ulong)(this->m_CampaignData).hosts.
                                              super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(long)p_Var33[3]._M_parent].hostname._M_dataplus._M_p
                                      );
          local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
          puVar25 = (ulong *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_7d0.field_2._M_allocated_capacity = *puVar25;
            local_7d0.field_2._8_8_ = plVar17[3];
          }
          else {
            local_7d0.field_2._M_allocated_capacity = *puVar25;
            local_7d0._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_7d0._M_string_length = plVar17[1];
          *plVar17 = (long)puVar25;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          plVar17 = (long *)std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_7d0,local_7d0._M_string_length,0,'\x01');
          local_7b0 = &local_7a0;
          plVar28 = plVar17 + 2;
          if ((long *)*plVar17 == plVar28) {
            local_7a0 = *plVar28;
            lStack_798 = plVar17[3];
          }
          else {
            local_7a0 = *plVar28;
            local_7b0 = (long *)*plVar17;
          }
          local_7a8 = plVar17[1];
          *plVar17 = (long)plVar28;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_7b0,
                                       (ulong)(this->super_Engine).m_Name._M_dataplus._M_p);
          psVar26 = (size_type *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar26) {
            local_7f0.field_2._M_allocated_capacity = *psVar26;
            local_7f0.field_2._8_8_ = plVar17[3];
            local_7f0._M_dataplus._M_p = (pointer)paVar37;
          }
          else {
            local_7f0.field_2._M_allocated_capacity = *psVar26;
            local_7f0._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_7f0._M_string_length = plVar17[1];
          *plVar17 = (long)psVar26;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[6],std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_6a8,(char (*) [6])0x73daf9,&local_7f0);
          lVar36 = local_6e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != paVar37) {
            operator_delete(local_7f0._M_dataplus._M_p);
          }
          if (local_7b0 != &local_7a0) {
            operator_delete(local_7b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
            operator_delete(local_7d0._M_dataplus._M_p);
          }
          local_6e8 = p_Var33;
          if ((size_t *)local_758.originalVar != &local_758.engineIdx) {
            operator_delete(local_758.originalVar);
          }
          uVar31 = *(uint *)(lVar36 + 0xd4);
          uVar29 = -uVar31;
          if (0 < (int)uVar31) {
            uVar29 = uVar31;
          }
          uVar38 = 1;
          if (9 < uVar29) {
            uVar35 = (ulong)uVar29;
            uVar11 = 4;
            do {
              uVar38 = uVar11;
              uVar15 = (uint)uVar35;
              if (uVar15 < 100) {
                uVar38 = uVar38 - 2;
                goto LAB_00652ee9;
              }
              if (uVar15 < 1000) {
                uVar38 = uVar38 - 1;
                goto LAB_00652ee9;
              }
              if (uVar15 < 10000) goto LAB_00652ee9;
              uVar35 = uVar35 / 10000;
              uVar11 = uVar38 + 4;
            } while (99999 < uVar15);
            uVar38 = uVar38 + 1;
          }
LAB_00652ee9:
          local_7f0._M_dataplus._M_p = (pointer)paVar37;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_7f0,(char)uVar38 - (char)((int)uVar31 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_7f0._M_dataplus._M_p + (uVar31 >> 0x1f),uVar38,uVar29);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[8],std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_6a8,(char (*) [8])0x749576,&local_7f0);
          p_Var33 = local_6e8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != paVar37) {
            operator_delete(local_7f0._M_dataplus._M_p);
          }
          pcVar18 = "AWS_EC2_METADATA_DISABLED=false";
          if (*(char *)(local_6e0 + 0xd1) != '\0') {
            pcVar18 = "AWS_EC2_METADATA_DISABLED=true";
          }
          local_7f0._M_dataplus._M_p = pcVar18 + 0x1a;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[17],char_const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_6a8,(char (*) [17])"recheck_metadata",(char **)&local_7f0);
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"File","");
          IO::AddTransport(this_01,&local_330,(Params *)local_6a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p);
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BP5","");
          IO::SetEngine(this_01,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          pbVar6 = (this->m_CampaignData).directory.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_7b0 = &local_7a0;
          pcVar3 = pbVar6[(long)p_Var33[3]._M_left]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7b0,pcVar3,
                     pcVar3 + pbVar6[(long)p_Var33[3]._M_left]._M_string_length);
          lVar36 = local_6e0;
          std::__cxx11::string::_M_replace_aux((ulong)&local_7b0,local_7a8,0,'\x01');
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7b0,(ulong)p_Var33[2]._M_parent);
          puVar25 = puVar19 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_7f0.field_2._M_allocated_capacity = *puVar25;
            local_7f0.field_2._8_8_ = puVar19[3];
            local_7f0._M_dataplus._M_p = (pointer)paVar37;
          }
          else {
            local_7f0.field_2._M_allocated_capacity = *puVar25;
            local_7f0._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_7f0._M_string_length = puVar19[1];
          *puVar19 = puVar25;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_708,(string *)&local_7f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != paVar37) {
            operator_delete(local_7f0._M_dataplus._M_p);
          }
          if (local_7b0 != &local_7a0) {
            operator_delete(local_7b0);
          }
          if (*(char *)(lVar36 + 0xd0) == '\x01') {
            local_7f0._M_dataplus._M_p = (pointer)paVar37;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_7f0,"AWS_EC2_METADATA_DISABLED=false","");
            adios2sys::SystemTools::PutEnv(&local_7f0);
          }
          else {
            local_7f0._M_dataplus._M_p = (pointer)paVar37;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_7f0,"AWS_EC2_METADATA_DISABLED=true","");
            adios2sys::SystemTools::PutEnv(&local_7f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != paVar37) {
            operator_delete(local_7f0._M_dataplus._M_p);
          }
          if (*(long *)(lVar36 + 0xb8) == 0) {
            local_7f0._M_dataplus._M_p = (pointer)paVar37;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_7f0,"AWS_PROFILE=default","");
            adios2sys::SystemTools::PutEnv(&local_7f0);
          }
          else {
            std::operator+(&local_7f0,"AWS_PROFILE=",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lVar36 + 0xb0));
            adios2sys::SystemTools::PutEnv(&local_7f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != paVar37) {
            operator_delete(local_7f0._M_dataplus._M_p);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_6a8);
          if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
            operator_delete((void *)local_738._0_8_);
          }
          if ((undefined1 *)local_790._0_8_ != local_790 + 0x10) {
            operator_delete((void *)local_790._0_8_);
          }
          goto LAB_00653201;
        }
        pbVar6 = (this->m_CampaignData).directory.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_6a8 = (undefined1  [8])local_698;
        pcVar3 = pbVar6[(long)p_Var33[3]._M_left]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6a8,pcVar3,
                   pcVar3 + pbVar6[(long)p_Var33[3]._M_left]._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)local_6a8,(ulong)_Stack_6a0._M_p,0,'\x01');
        plVar17 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_6a8,(ulong)p_Var33[2]._M_parent);
        local_790._0_8_ = local_790 + 0x10;
        psVar26 = (size_type *)(plVar17 + 2);
        if ((size_type *)*plVar17 == psVar26) {
          local_790._16_8_ = *psVar26;
          local_790._24_8_ = plVar17[3];
        }
        else {
          local_790._16_8_ = *psVar26;
          local_790._0_8_ = (size_type *)*plVar17;
        }
        local_790._8_8_ = plVar17[1];
        *plVar17 = (long)psVar26;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        if (local_6a8 != (undefined1  [8])local_698) {
          operator_delete((void *)local_6a8);
        }
        pCVar34 = (this->m_CampaignData).hosts.
                  super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_6a8 = (undefined1  [8])local_698;
        _Var9._M_p = pCVar34[(long)p_Var33[3]._M_parent].hostname._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6a8,_Var9._M_p,
                   _Var9._M_p + pCVar34[(long)p_Var33[3]._M_parent].hostname._M_string_length);
        std::__cxx11::string::append((char *)local_6a8);
        puVar19 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_6a8,local_790._0_8_);
        local_738._0_8_ = local_738 + 0x10;
        psVar26 = puVar19 + 2;
        if ((size_type *)*puVar19 == psVar26) {
          local_738._16_8_ = *psVar26;
          local_738._24_8_ = puVar19[3];
        }
        else {
          local_738._16_8_ = *psVar26;
          local_738._0_8_ = (size_type *)*puVar19;
        }
        local_738._8_8_ = puVar19[1];
        *puVar19 = psVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        if (local_6a8 != (undefined1  [8])local_698) {
          operator_delete((void *)local_6a8);
        }
        local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
        pcVar3 = (this->m_Options).cachepath._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7d0,pcVar3,pcVar3 + (this->m_Options).cachepath._M_string_length
                  );
        std::__cxx11::string::_M_replace_aux((ulong)&local_7d0,local_7d0._M_string_length,0,'\x01');
        std::__cxx11::string::substr((ulong)&local_758,(ulong)&p_Var33[1]._M_parent);
        uVar30 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
          uVar30 = local_7d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < local_758.ioIdx + local_7d0._M_string_length) {
          uVar35 = 0xf;
          if ((size_t *)local_758.originalVar != &local_758.engineIdx) {
            uVar35 = local_758.engineIdx;
          }
          if (uVar35 < local_758.ioIdx + local_7d0._M_string_length) goto LAB_006520b0;
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_758,0,(char *)0x0,(ulong)local_7d0._M_dataplus._M_p);
        }
        else {
LAB_006520b0:
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7d0,(ulong)local_758.originalVar)
          ;
        }
        local_7b0 = &local_7a0;
        plVar17 = puVar19 + 2;
        if ((long *)*puVar19 == plVar17) {
          local_7a0 = *plVar17;
          lStack_798 = puVar19[3];
        }
        else {
          local_7a0 = *plVar17;
          local_7b0 = (long *)*puVar19;
        }
        local_7a8 = puVar19[1];
        *puVar19 = plVar17;
        puVar19[1] = 0;
        *(undefined1 *)plVar17 = 0;
        plVar17 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_7b0,local_7a8,0,'\x01')
        ;
        puVar25 = (ulong *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar25) {
          local_7f0.field_2._M_allocated_capacity = *puVar25;
          local_7f0.field_2._8_8_ = plVar17[3];
          local_7f0._M_dataplus._M_p = (pointer)paVar37;
        }
        else {
          local_7f0.field_2._M_allocated_capacity = *puVar25;
          local_7f0._M_dataplus._M_p = (pointer)*plVar17;
        }
        local_7f0._M_string_length = plVar17[1];
        *plVar17 = (long)puVar25;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        puVar19 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)p_Var33[1]._M_parent);
        puVar25 = puVar19 + 2;
        if ((ulong *)*puVar19 == puVar25) {
          local_698._0_8_ = *puVar25;
          local_698._8_8_ = puVar19[3];
          local_6a8 = (undefined1  [8])local_698;
        }
        else {
          local_698._0_8_ = *puVar25;
          local_6a8 = (undefined1  [8])*puVar19;
        }
        _Stack_6a0._M_p = (pointer)puVar19[1];
        *puVar19 = puVar25;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_708,(string *)local_6a8);
        if (local_6a8 != (undefined1  [8])local_698) {
          operator_delete((void *)local_6a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != paVar37) {
          operator_delete(local_7f0._M_dataplus._M_p);
        }
        if (local_7b0 != &local_7a0) {
          operator_delete(local_7b0);
        }
        if ((size_t *)local_758.originalVar != &local_758.engineIdx) {
          operator_delete(local_758.originalVar);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
          operator_delete(local_7d0._M_dataplus._M_p);
        }
        if (0 < (this->m_Options).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Open remote file ",0x11);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_738._0_8_,local_738._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,"\n    and use local cache for metadata at ",0x29);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar20,local_708._M_dataplus._M_p,local_708._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," \n",2);
        }
        helper::CreateDirectory(&local_708);
        local_7f0._M_string_length = 0;
        local_7f0.field_2._M_allocated_capacity =
             local_7f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_7f0._M_dataplus._M_p = (pointer)paVar37;
        if (*(char *)&p_Var33[3]._M_right == '\x01') {
          if (0 < (this->m_Options).verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"The dataset is key protected with key id ",0x29);
            pCVar27 = (this->m_CampaignData).keys.
                      super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 pCVar27[*(long *)(p_Var33 + 4)].id._M_dataplus._M_p,
                                 pCVar27[*(long *)(p_Var33 + 4)].id._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
          }
          lVar36 = *(long *)(p_Var33 + 4);
          pCVar27 = (this->m_CampaignData).keys.
                    super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pCVar27[lVar36].keyHex._M_string_length == 0) {
            if (local_760 == (Remote *)0x0) {
              local_760 = (Remote *)operator_new(0x20);
              hostOptions = ADIOS::StaticGetHostOptions_abi_cxx11_();
              Remote::Remote(local_760,hostOptions);
              lVar36 = *(long *)(p_Var33 + 4);
              pCVar27 = (this->m_CampaignData).keys.
                        super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
            _Var9._M_p = pCVar27[lVar36].id._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_350,_Var9._M_p,
                       _Var9._M_p + pCVar27[lVar36].id._M_string_length);
            Remote::GetKeyFromConnectionManager((string *)local_6a8,local_760,&local_350);
            std::__cxx11::string::operator=
                      ((string *)
                       &(this->m_CampaignData).keys.
                        super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                        ._M_impl.super__Vector_impl_data._M_start[*(long *)(p_Var33 + 4)].keyHex,
                       (string *)local_6a8);
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p);
            }
            if (0 < (this->m_Options).verbose) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"-- Received key ",0x10);
              pCVar27 = (this->m_CampaignData).keys.
                        super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   pCVar27[*(long *)(p_Var33 + 4)].keyHex._M_dataplus._M_p,
                                   pCVar27[*(long *)(p_Var33 + 4)].keyHex._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            }
          }
          iVar14 = std::__cxx11::string::compare
                             ((char *)&(this->m_CampaignData).keys.
                                       super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [*(long *)(p_Var33 + 4)].keyHex);
          if (iVar14 != 0) {
            std::__cxx11::string::_M_assign((string *)&local_7f0);
            goto LAB_0065252d;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR: don\'t have the key ",0x1a);
          pCVar27 = (this->m_CampaignData).keys.
                    super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               pCVar27[*(long *)(p_Var33 + 4)].id._M_dataplus._M_p,
                               pCVar27[*(long *)(p_Var33 + 4)].id._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," to decrypt ",0xc);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar20,(char *)p_Var33[2]._M_parent,(long)p_Var33[2]._M_left);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,". Ignoring this dataset.",0x18);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
          std::ostream::put((char)poVar20);
          std::ostream::flush();
          bVar12 = false;
        }
        else {
LAB_0065252d:
          pCVar10 = (CampaignBPFile *)p_Var33[4]._M_left;
          for (bpfile = (CampaignBPFile *)p_Var33[4]._M_parent; bpfile != pCVar10;
              bpfile = bpfile + 1) {
            db = *local_6d8;
            local_7b0 = &local_7a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_7b0,local_708._M_dataplus._M_p,
                       local_708._M_dataplus._M_p + local_708._M_string_length);
            std::__cxx11::string::_M_replace_aux((ulong)&local_7b0,local_7a8,0,'\x01');
            puVar19 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_7b0,(ulong)(bpfile->name)._M_dataplus._M_p);
            local_6a8 = (undefined1  [8])local_698;
            puVar25 = puVar19 + 2;
            if ((ulong *)*puVar19 == puVar25) {
              local_698._0_8_ = *puVar25;
              local_698._8_8_ = puVar19[3];
            }
            else {
              local_698._0_8_ = *puVar25;
              local_6a8 = (undefined1  [8])*puVar19;
            }
            _Stack_6a0._M_p = (pointer)puVar19[1];
            *puVar19 = puVar25;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            SaveToFile(db,(string *)local_6a8,bpfile,&local_7f0);
            if (local_6a8 != (undefined1  [8])local_698) {
              operator_delete((void *)local_6a8);
            }
            if (local_7b0 != &local_7a0) {
              operator_delete(local_7b0);
            }
          }
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"RemoteDataPath","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_790._0_8_,(char *)(local_790._0_8_ + local_790._8_8_)
                    );
          IO::SetParameter(this_01,&local_370,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p);
          }
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"RemoteHost","");
          pCVar34 = (this->m_CampaignData).hosts.
                    super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          _Var9._M_p = pCVar34[(long)p_Var33[3]._M_parent].hostname._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,_Var9._M_p,
                     _Var9._M_p + pCVar34[(long)p_Var33[3]._M_parent].hostname._M_string_length);
          IO::SetParameter(this_01,&local_2f0,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"UUID","");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,p_Var33[1]._M_parent,
                     (long)&(p_Var33[1]._M_left)->_M_color + (long)p_Var33[1]._M_parent);
          IO::SetParameter(this_01,&local_310,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p);
          }
          local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7d0,local_708._M_dataplus._M_p,
                     local_708._M_dataplus._M_p + local_708._M_string_length);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)&local_7d0,local_7d0._M_string_length,0,'\x01');
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_7d0);
          local_7b0 = &local_7a0;
          plVar17 = puVar19 + 2;
          if ((long *)*puVar19 == plVar17) {
            local_7a0 = *plVar17;
            lStack_798 = puVar19[3];
          }
          else {
            local_7a0 = *plVar17;
            local_7b0 = (long *)*puVar19;
          }
          local_7a8 = puVar19[1];
          *puVar19 = plVar17;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::ofstream::ofstream
                    ((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_6a8,(string *)&local_7b0,_S_out);
          if (local_7b0 != &local_7a0) {
            operator_delete(local_7b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
            operator_delete(local_7d0._M_dataplus._M_p);
          }
          cVar13 = std::__basic_file<char>::is_open();
          if (cVar13 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6a8,"Campaign = ",0xb);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6a8,(this->super_Engine).m_Name._M_dataplus._M_p,
                                 (this->super_Engine).m_Name._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"Dataset = ",10)
            ;
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6a8,(char *)p_Var33[2]._M_parent,
                                 (long)p_Var33[2]._M_left);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6a8,"RemoteHost = ",0xd);
            pCVar34 = (this->m_CampaignData).hosts.
                      super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6a8,
                                 pCVar34[(long)p_Var33[3]._M_parent].hostname._M_dataplus._M_p,
                                 pCVar34[(long)p_Var33[3]._M_parent].hostname._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6a8,"RemoteDataPath = ",0x11);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6a8,(char *)local_790._0_8_,local_790._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            std::ofstream::close();
          }
          local_6a8 = (undefined1  [8])local_390;
          *(undefined8 *)(local_6a8 + local_390[-3]) = local_398;
          std::filebuf::~filebuf((filebuf *)&_Stack_6a0);
          std::ios_base::~ios_base(local_5b0);
          bVar12 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p);
        }
        if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
          operator_delete((void *)local_738._0_8_);
        }
        if ((undefined1 *)local_790._0_8_ != local_790 + 0x10) {
          operator_delete((void *)local_790._0_8_);
        }
        if (bVar12) goto LAB_00653201;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_708._M_dataplus._M_p != &local_708.field_2) {
        operator_delete(local_708._M_dataplus._M_p);
      }
      local_6e8 = (_Base_ptr)std::_Rb_tree_increment(p_Var33);
      uVar31 = local_6cc;
    } while (local_6e8 != local_380);
    if (local_760 != (Remote *)0x0) {
      (*local_760->_vptr_Remote[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CampaignReader::InitTransports()
{
    std::string path = m_Name;
    if (!adios2sys::SystemTools::FileExists(path) && path[0] != '/' && path[0] != '\\' &&
        !m_Options.campaignstorepath.empty())
    {
        std::string path2 = m_Options.campaignstorepath + PathSeparator + m_Name;
        if (adios2sys::SystemTools::FileExists(path2))
        {
            path = path2;
        }
    }

    int rc = sqlite3_open(path.c_str(), &m_DB);
    if (rc)
    {
        std::string dbmsg(sqlite3_errmsg(m_DB));
        sqlite3_close(m_DB);
        helper::Throw<std::invalid_argument>("Engine", "CampaignReader", "Open",
                                             "Cannot open database" + path + ": " + dbmsg);
    }

    ReadCampaignData(m_DB, m_CampaignData);

    if (m_Options.verbose > 0)
    {
        std::cout << "Local hostname = " << m_Options.hostname << "\n";
        std::cout << "Database result:\n  version = " << m_CampaignData.version.version
                  << "\n  hosts:\n";

        for (size_t hostidx = 0; hostidx < m_CampaignData.hosts.size(); ++hostidx)
        {
            CampaignHost &h = m_CampaignData.hosts[hostidx];
            std::cout << "    host = " << h.hostname << "  long name = " << h.longhostname
                      << "  directories: \n";
            for (size_t diridx = 0; diridx < h.dirIdx.size(); ++diridx)
            {
                std::cout << "      dir = " << m_CampaignData.directory[h.dirIdx[diridx]] << "\n";
            }
        }
        std::cout << "  keys:\n";
        for (size_t keyidx = 0; keyidx < m_CampaignData.keys.size(); ++keyidx)
        {
            CampaignKey &k = m_CampaignData.keys[keyidx];
            std::cout << "    key = " << k.id << "\n";
        }
        std::cout << "  datasets:\n";
        for (auto &it : m_CampaignData.bpdatasets)
        {
            CampaignBPDataset &ds = it.second;
            std::cout << "    " << m_CampaignData.hosts[ds.hostIdx].hostname << ":"
                      << m_CampaignData.directory[ds.dirIdx] << PathSeparator << ds.name << "\n";
            std::cout << "      uuid: " << ds.uuid << "\n";
            for (auto &bpf : ds.files)
            {
                std::cout << "      file: " << bpf.name << "\n";
            }
        }
    }

    // std::string cs = m_Comm.BroadcastFile(m_Name, "broadcast campaign file");
    // nlohmann::json js = nlohmann::json::parse(cs);
    // std::cout << "JSON rank " << m_ReaderRank << ": " << js.size() <<
    // std::endl;
    std::unique_ptr<Remote> connectionManager = nullptr;
    int i = -1;
    for (auto &it : m_CampaignData.bpdatasets)
    {
        ++i;
        CampaignBPDataset &ds = it.second;
        adios2::core::IO &io = m_IO.m_ADIOS.DeclareIO("CampaignReader" + std::to_string(i));
        std::string localPath;
        if (m_CampaignData.hosts[ds.hostIdx].hostname != m_Options.hostname)
        {
            bool done = false;
            auto it = m_HostOptions.find(m_CampaignData.hosts[ds.hostIdx].hostname);
            if (it != m_HostOptions.end())
            {
                const HostConfig &ho = (it->second).front();
                if (ho.protocol == HostAccessProtocol::S3)
                {
                    const std::string endpointURL = ho.endpoint;
                    const std::string objPath = m_CampaignData.directory[ds.dirIdx] + "/" + ds.name;
                    Params p;
                    p.emplace("Library", "awssdk");
                    p.emplace("endpoint", endpointURL);
                    p.emplace("cache", m_Options.cachepath + PathSeparator +
                                           m_CampaignData.hosts[ds.hostIdx].hostname +
                                           PathSeparator + m_Name);
                    p.emplace("verbose", std::to_string(ho.verbose));
                    p.emplace("recheck_metadata", (ho.recheckMetadata ? "true" : "false"));
                    io.AddTransport("File", p);
                    io.SetEngine("BP5");
                    localPath = m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
                    if (ho.isAWS_EC2)
                    {
                        adios2sys::SystemTools::PutEnv("AWS_EC2_METADATA_DISABLED=false");
                    }
                    else
                    {
                        adios2sys::SystemTools::PutEnv("AWS_EC2_METADATA_DISABLED=true");
                    }

                    if (ho.awsProfile.empty())
                    {
                        adios2sys::SystemTools::PutEnv("AWS_PROFILE=default");
                    }
                    else
                    {
                        std::string es = "AWS_PROFILE=" + ho.awsProfile;
                        adios2sys::SystemTools::PutEnv(es);
                    }

                    done = true;
                }
            }

            if (!done)
            {
                const std::string remotePath =
                    m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
                const std::string remoteURL =
                    m_CampaignData.hosts[ds.hostIdx].hostname + ":" + remotePath;
                localPath = m_Options.cachepath + PathSeparator + ds.uuid.substr(0, 3) +
                            PathSeparator + ds.uuid;
                if (m_Options.verbose > 0)
                {
                    std::cout << "Open remote file " << remoteURL
                              << "\n    and use local cache for metadata at " << localPath << " \n";
                }
                helper::CreateDirectory(localPath);

                std::string keyhex;
                if (ds.hasKey)
                {
                    if (m_Options.verbose > 0)
                    {
                        std::cout << "The dataset is key protected with key id "
                                  << m_CampaignData.keys[ds.keyIdx].id << "\n";
                    }
#ifdef ADIOS2_HAVE_SODIUM
                    if (m_CampaignData.keys[ds.keyIdx].keyHex.empty())
                    {
                        // Retrieve key
                        if (!connectionManager)
                        {
                            connectionManager = std::unique_ptr<Remote>(
                                new Remote(core::ADIOS::StaticGetHostOptions()));
                        }
                        m_CampaignData.keys[ds.keyIdx].keyHex =
                            connectionManager->GetKeyFromConnectionManager(
                                m_CampaignData.keys[ds.keyIdx].id);

                        if (m_Options.verbose > 0)
                        {
                            std::cout << "-- Received key " << m_CampaignData.keys[ds.keyIdx].keyHex
                                      << "\n";
                        }
                    }

                    if (m_CampaignData.keys[ds.keyIdx].keyHex == "0")
                    {
                        // We received no key, ignore files encrypted with this key
                        std::cerr << "ERROR: don't have the key "
                                  << m_CampaignData.keys[ds.keyIdx].id << " to decrypt " << ds.name
                                  << ". Ignoring this dataset." << std::endl;
                        continue;
                    }

                    keyhex = m_CampaignData.keys[ds.keyIdx].keyHex;
#else
                    helper::Throw<std::runtime_error>(
                        "Engine", "CampaignReader", "InitTransports",
                        "ADIOS needs to be built with libsodium and with SST to "
                        "be able to process protected campaign files");
#endif
                }

                for (auto &bpf : ds.files)
                {
                    SaveToFile(m_DB, localPath + PathSeparator + bpf.name, bpf, keyhex);
                }
                io.SetParameter("RemoteDataPath", remotePath);
                io.SetParameter("RemoteHost", m_CampaignData.hosts[ds.hostIdx].hostname);
                io.SetParameter("UUID", ds.uuid);

                // Save info in cache directory for cache manager and for humans
                {
                    std::ofstream f(localPath + PathSeparator + "info.txt");
                    if (f.is_open())
                    {
                        f << "Campaign = " << m_Name << "\n";
                        f << "Dataset = " << ds.name << "\n";
                        f << "RemoteHost = " << m_CampaignData.hosts[ds.hostIdx].hostname << "\n";
                        f << "RemoteDataPath = " << remotePath << "\n";
                        f.close();
                    }
                }
            }
        }
        else
        {
            localPath = m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
            if (m_Options.verbose > 0)
            {
                std::cout << "Open local file " << localPath << "\n";
            }
        }

        adios2::core::Engine &e = io.Open(localPath, m_OpenMode, m_Comm.Duplicate());

        m_IOs.push_back(&io);
        m_Engines.push_back(&e);

        auto vmap = io.GetAvailableVariables();
        auto amap = io.GetAvailableAttributes();
        VarInternalInfo internalInfo(nullptr, m_IOs.size() - 1, m_Engines.size() - 1);

        for (auto &vr : vmap)
        {
            auto vname = vr.first;
            std::string fname = ds.name;
            std::string newname = fname + "/" + vname;

            const DataType type = io.InquireVariableType(vname);

            if (type == DataType::Struct)
            {
            }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *vi = io.InquireVariable<T>(vname);                                            \
        Variable<T> v = DuplicateVariable(vi, m_IO, newname, internalInfo);                        \
    }

            ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        }

        for (auto &ar : amap)
        {
            auto aname = ar.first;
            std::string fname = ds.name;
            std::string newname = fname + "/" + aname;

            const DataType type = io.InquireAttributeType(aname);

            if (type == DataType::Struct)
            {
            }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Attribute<T> *ai = io.InquireAttribute<T>(aname);                                          \
        Attribute<T> v = DuplicateAttribute(ai, m_IO, newname);                                    \
    }

            ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        }
    }
}